

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramCopyAndAnalyze(VP8LHistogramSet *orig_histo,VP8LHistogramSet *image_histo)

{
  long lVar1;
  int *in_RSI;
  long in_RDI;
  VP8LHistogram *histo;
  VP8LHistogram **histograms;
  VP8LHistogram **orig_histograms;
  int i;
  VP8LHistogram *dst;
  VP8LHistogram *h;
  int local_14;
  
  h = *(VP8LHistogram **)(in_RDI + 8);
  dst = *(VP8LHistogram **)(in_RSI + 2);
  *in_RSI = 0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    lVar1 = *(long *)(h->red + (long)local_14 * 2 + -2);
    ComputeHistogramCost(h);
    if ((((*(char *)(lVar1 + 0xce8) == '\0') && (*(char *)(lVar1 + 0xce9) == '\0')) &&
        (*(char *)(lVar1 + 0xcea) == '\0')) &&
       ((*(char *)(lVar1 + 0xceb) == '\0' && (*(char *)(lVar1 + 0xcec) == '\0')))) {
      (h->red + (long)local_14 * 2 + -2)[0] = 0;
      (h->red + (long)local_14 * 2 + -2)[1] = 0;
    }
    else {
      HistogramCopy(h,dst);
      *in_RSI = *in_RSI + 1;
    }
  }
  return;
}

Assistant:

static void HistogramCopyAndAnalyze(VP8LHistogramSet* const orig_histo,
                                    VP8LHistogramSet* const image_histo) {
  int i;
  VP8LHistogram** const orig_histograms = orig_histo->histograms;
  VP8LHistogram** const histograms = image_histo->histograms;
  assert(image_histo->max_size == orig_histo->max_size);
  image_histo->size = 0;
  for (i = 0; i < orig_histo->max_size; ++i) {
    VP8LHistogram* const histo = orig_histograms[i];
    ComputeHistogramCost(histo);

    // Skip the histogram if it is completely empty, which can happen for tiles
    // with no information (when they are skipped because of LZ77).
    if (!histo->is_used[LITERAL] && !histo->is_used[RED] &&
        !histo->is_used[BLUE] && !histo->is_used[ALPHA] &&
        !histo->is_used[DISTANCE]) {
      // The first histogram is always used.
      assert(i > 0);
      orig_histograms[i] = NULL;
    } else {
      // Copy histograms from orig_histo[] to image_histo[].
      HistogramCopy(histo, histograms[image_histo->size]);
      ++image_histo->size;
    }
  }
}